

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O1

QP2PassNodeResult __thiscall mp::QP2PassVisitor::DoVisitPow2(QP2PassVisitor *this,Expr expr)

{
  AffineExpr *pAVar1;
  bool bVar2;
  QP2PassNodeResult QVar3;
  int iVar4;
  longdouble lVar5;
  AffineExpr aeL;
  AffineExpr local_98;
  
  if (*(int *)expr.super_ExprBase.impl_ == 1) {
    lVar5 = this->factor_ * (longdouble)*(double *)((long)expr.super_ExprBase.impl_ + 8) *
            (longdouble)*(double *)((long)expr.super_ExprBase.impl_ + 8);
    pAVar1 = this->p_ae_;
    if (pAVar1 == (AffineExpr *)0x0) {
      iVar4 = 0;
      if (this->pass_ == 2) {
        this->const_term_ = this->const_term_ + lVar5;
      }
    }
    else {
      pAVar1->constant_term_ = pAVar1->constant_term_ + (double)lVar5;
      iVar4 = 0;
    }
  }
  else {
    local_98.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_98.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data.m_storage;
    local_98.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_98.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_98.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_98.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_98.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data
               .m_storage;
    local_98.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_98.constant_term_ = 0.0;
    QVar3 = VisitAtmostAffine(this,expr,&local_98);
    iVar4 = 1000;
    if (QVar3 * 2 <= this->mode_) {
      if (QVar3 == 0) {
        lVar5 = (longdouble)local_98.constant_term_ *
                this->factor_ * (longdouble)local_98.constant_term_;
        pAVar1 = this->p_ae_;
        if (pAVar1 == (AffineExpr *)0x0) {
          iVar4 = 0;
          if (this->pass_ == 2) {
            this->const_term_ = this->const_term_ + lVar5;
          }
        }
        else {
          pAVar1->constant_term_ = pAVar1->constant_term_ + (double)lVar5;
          iVar4 = 0;
        }
      }
      else {
        bVar2 = ProcessAffineFactors(this,&local_98,&local_98);
        iVar4 = 1000;
        if (bVar2) {
          iVar4 = QVar3 * 2;
        }
      }
    }
    if (6 < local_98.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_98.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
                      .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_98.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
                      .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_98.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_98.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_98.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
  }
  return iVar4;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::DoVisitPow2(
    Expr expr) {
  auto isc = IsConst(expr);
  if (isc.first) {
    DoAddConst(factor_ * isc.second * isc.second);
    return 0;
  }
  AffineExpr aeL;
  int degL = VisitAtmostAffine(expr, aeL);
  if (degL*2 > mode_)
    return 1000;               // abort top-level term
  if (!degL) {                 // can happen
    DoAddConst(factor_
               * aeL.constant_term() * aeL.constant_term());
    return 0;
  }
  if (!ProcessAffineFactors(aeL, aeL))
    return 1000;
  return degL*2;
}